

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O3

int vasprintf(char **__ptr,char *__f,__gnuc_va_list __arg)

{
  int iVar1;
  char *__s;
  char tmp [1];
  va_list ap2;
  char local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = *(undefined8 *)((long)__arg + 0x10);
  local_38 = *__arg;
  uStack_30 = *(undefined8 *)((long)__arg + 8);
  iVar1 = vsnprintf(&local_39,1,__f,&local_38);
  if (0 < iVar1) {
    __s = (char *)malloc((ulong)(iVar1 + 1));
    *__ptr = __s;
    iVar1 = vsnprintf(__s,(ulong)(iVar1 + 1),__f,__arg);
  }
  return iVar1;
}

Assistant:

int vasprintf(char ** strp, const char * fmt, va_list ap) {
	va_list ap2;
	va_copy(ap2, ap);

#if (defined(_WIN32) || defined(__WIN32__))
	char * tmp = NULL;
	int size = vsnprintf(tmp, 0, fmt, ap2);
#else
	char tmp[1];
	int size = vsnprintf(tmp, 1, fmt, ap2);
#endif

	if (size <= 0) {
		return size;
	}

	va_end(ap2);
	size += 1;
	*strp = (char *)malloc(size * sizeof(char));
	return vsnprintf(*strp, size, fmt, ap);
}